

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item_Array.cxx
# Opt level: O0

void __thiscall Fl_Tree_Item_Array::clear(Fl_Tree_Item_Array *this)

{
  Fl_Tree_Item *this_00;
  int local_14;
  int t;
  Fl_Tree_Item_Array *this_local;
  
  if (this->_items != (Fl_Tree_Item **)0x0) {
    for (local_14 = 0; local_14 < this->_total; local_14 = local_14 + 1) {
      this_00 = this->_items[local_14];
      if (this_00 != (Fl_Tree_Item *)0x0) {
        Fl_Tree_Item::~Fl_Tree_Item(this_00);
        operator_delete(this_00,0x88);
      }
      this->_items[local_14] = (Fl_Tree_Item *)0x0;
    }
    free(this->_items);
    this->_items = (Fl_Tree_Item **)0x0;
  }
  this->_size = 0;
  this->_total = 0;
  return;
}

Assistant:

void Fl_Tree_Item_Array::clear() {
  if ( _items ) {
    for ( int t=0; t<_total; t++ ) {
#if FLTK_ABI_VERSION >= 10303
      if ( _flags & MANAGE_ITEM )
#endif
      {
        delete _items[t];
	_items[t] = 0;
      }
    }
    free((void*)_items); _items = 0;
  }
  _total = _size = 0;
}